

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O1

void __thiscall
CTestGen9Resource_Test3DTileYsResource_Test::TestBody
          (CTestGen9Resource_Test3DTileYsResource_Test *this)

{
  uint uVar1;
  CTestGen9Resource_Test3DTileYsResource_Test *pCVar2;
  CTestGen9Resource_Test3DTileYsResource_Test *this_00;
  undefined4 uVar3;
  GMM_RESOURCE_INFO *pGVar4;
  ulong uVar5;
  uint32_t i_3;
  uint32_t *puVar6;
  long lVar7;
  uint32_t i;
  ulong uVar8;
  uint32_t i_1;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  CTestGen9Resource_Test3DTileYsResource_Test *local_40;
  uint *local_38;
  
  local_68 = 0;
  uStack_b0 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_c8 = 3;
  uStack_60 = 0x100000000;
  uStack_c0 = 0x400000000;
  local_b8 = 0x5000000000;
  puVar6 = &DAT_001ac570;
  lVar7 = 0;
  uVar8 = 0;
  local_40 = this;
  do {
    uVar3 = 0;
    if (uVar8 < 5) {
      uVar3 = *(undefined4 *)((long)&DAT_001ad0dc + lVar7);
    }
    local_c8 = CONCAT44(uVar3,(undefined4)local_c8);
    local_98 = 1;
    uStack_90 = 0x100000001;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_001ac530 + lVar7));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_001ac550 + lVar7));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,*puVar6);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,1);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    pCVar2 = local_40;
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 4;
    puVar6 = puVar6 + 3;
  } while (uVar8 != 5);
  local_38 = &DAT_001ac570;
  lVar7 = 0;
  uVar8 = 0;
  do {
    uVar3 = 0;
    if (uVar8 < 5) {
      uVar3 = *(undefined4 *)((long)&DAT_001ad0dc + lVar7);
    }
    local_c8 = CONCAT44(uVar3,(undefined4)local_c8);
    uVar5 = 0;
    if (uVar8 < 5) {
      uVar5 = (ulong)*(uint *)((long)&DAT_001ad0f0 + lVar7);
    }
    uVar1 = *local_38;
    local_98 = (ulong)((int)(uVar1 / uVar5) + 1);
    uStack_90 = 0x100000001;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8,(ulong)uVar1 % uVar5);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)pCVar2,pGVar4,*(uint32_t *)((long)&DAT_001ac530 + lVar7));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)pCVar2,pGVar4,*(uint32_t *)((long)&DAT_001ac550 + lVar7));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)pCVar2,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)pCVar2,pGVar4,2);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    this_00 = local_40;
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 4;
    local_38 = local_38 + 3;
  } while (uVar8 != 5);
  local_38 = (uint *)&DAT_001ac574;
  lVar7 = 0;
  uVar8 = 0;
  do {
    uVar3 = 0;
    if (uVar8 < 5) {
      uVar3 = *(undefined4 *)((long)&DAT_001ad0dc + lVar7);
    }
    local_c8 = CONCAT44(uVar3,(undefined4)local_c8);
    uVar5 = 0;
    if (uVar8 < 5) {
      uVar5 = (ulong)*(uint *)((long)&DAT_001ad0f0 + lVar7);
    }
    uVar1 = ((int *)local_38)[-1];
    local_98 = (ulong)((int)(uVar1 / uVar5) + 1);
    uStack_90 = CONCAT44(1,*local_38 + 1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8,(ulong)uVar1 % uVar5);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this_00,pGVar4,*(uint32_t *)((long)&DAT_001ac530 + lVar7));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this_00,pGVar4,*(uint32_t *)((long)&DAT_001ac550 + lVar7));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this_00,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this_00,pGVar4,2);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    pCVar2 = local_40;
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 4;
    local_38 = local_38 + 3;
  } while (uVar8 != 5);
  local_38 = (uint *)&DAT_001ac574;
  lVar7 = 0;
  uVar8 = 0;
  do {
    uVar3 = 0;
    if (uVar8 < 5) {
      uVar3 = *(undefined4 *)((long)&DAT_001ad0dc + lVar7);
    }
    local_c8 = CONCAT44(uVar3,(undefined4)local_c8);
    uVar5 = 0;
    if (uVar8 < 5) {
      uVar5 = (ulong)*(uint *)((long)&DAT_001ad0f0 + lVar7);
    }
    uVar1 = *(uint *)((long)local_38 + -4);
    local_98 = (ulong)((int)(uVar1 / uVar5) + 1);
    uStack_90 = CONCAT44((int)((ulong)*(undefined8 *)local_38 >> 0x20) + 1,
                         (int)*(undefined8 *)local_38 + 1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c8,(ulong)uVar1 % uVar5);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)pCVar2,pGVar4,*(uint32_t *)((long)&DAT_001ac530 + lVar7));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)pCVar2,pGVar4,*(uint32_t *)((long)&DAT_001ac550 + lVar7));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)pCVar2,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)pCVar2,pGVar4,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)pCVar2,pGVar4,0x80000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 4;
    local_38 = (uint *)((long)local_38 + 0xc);
  } while (uVar8 != 5);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test3DTileYsResource)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign[TEST_BPP_MAX] = {64, 32, 32, 32, 16};
    const uint32_t VAlign[TEST_BPP_MAX] = {32, 32, 32, 16, 16};

    const uint32_t TileSize[TEST_BPP_MAX][3] = {{64, 32, 32},
                                                {64, 32, 32},
                                                {128, 32, 16},
                                                {256, 16, 16},
                                                {256, 16, 16}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_3D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64));  // 1 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64) * 2);  // 2 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<false>(ResourceInfo, GMM_KBYTE(64) * 4);  // 4 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y/Z dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = TileSize[i][2] + 1;                      // 1 plane larger than 1 tile depth

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(64) * 8);   // 8 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}